

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O1

bool __thiscall RTIMULSM9DS1::setGyroSampleRate(RTIMULSM9DS1 *this)

{
  uint uVar1;
  int iVar2;
  RTIMUSettings *this_00;
  undefined1 auVar3 [16];
  bool bVar4;
  byte data;
  char *__format;
  RTFLOAT RVar5;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_LSM9DS1GyroSampleRate;
  if (5 < (ulong)uVar1) {
    __format = "Illegal LSM9DS1 gyro sample rate code %d\n";
LAB_0011a9e0:
    fprintf(_stderr,__format,(ulong)uVar1);
    return false;
  }
  iVar2 = *(int *)(&DAT_00123e78 + (ulong)uVar1 * 4);
  data = (char)uVar1 * ' ' + 0x20;
  (this->super_RTIMU).m_sampleRate = iVar2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar2;
  (this->super_RTIMU).m_sampleInterval = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000)) / auVar3,0);
  iVar2 = this_00->m_LSM9DS1GyroBW;
  if (iVar2 == 3) {
    data = data | 3;
  }
  else if (iVar2 == 2) {
    data = data | 2;
  }
  else if (iVar2 == 1) {
    data = data | 1;
  }
  uVar1 = this_00->m_LSM9DS1GyroFsr;
  if (uVar1 == 0) {
    RVar5 = 0.00015271631;
  }
  else if (uVar1 == 3) {
    data = data | 0x18;
    RVar5 = 0.0012217305;
  }
  else {
    if (uVar1 != 1) {
      __format = "Illegal LSM9DS1 gyro FSR code %d\n";
      goto LAB_0011a9e0;
    }
    data = data | 8;
    RVar5 = 0.00030543262;
  }
  this->m_gyroScale = RVar5;
  bVar4 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelGyroSlaveAddr,'\x10',data,
                             "Failed to set LSM9DS1 gyro CTRL1");
  return bVar4;
}

Assistant:

bool RTIMULSM9DS1::setGyroSampleRate()
{
    unsigned char ctrl1;

    switch (m_settings->m_LSM9DS1GyroSampleRate) {
    case LSM9DS1_GYRO_SAMPLERATE_14_9:
        ctrl1 = 0x20;
        m_sampleRate = 15;
        break;

    case LSM9DS1_GYRO_SAMPLERATE_59_5:
        ctrl1 = 0x40;
        m_sampleRate = 60;
        break;

    case LSM9DS1_GYRO_SAMPLERATE_119:
        ctrl1 = 0x60;
        m_sampleRate = 119;
        break;

    case LSM9DS1_GYRO_SAMPLERATE_238:
        ctrl1 = 0x80;
        m_sampleRate = 238;
        break;

    case LSM9DS1_GYRO_SAMPLERATE_476:
        ctrl1 = 0xa0;
        m_sampleRate = 476;
        break;

    case LSM9DS1_GYRO_SAMPLERATE_952:
        ctrl1 = 0xc0;
        m_sampleRate = 952;
        break;

    default:
        HAL_ERROR1("Illegal LSM9DS1 gyro sample rate code %d\n", m_settings->m_LSM9DS1GyroSampleRate);
        return false;
    }

    m_sampleInterval = (uint64_t)1000000 / m_sampleRate;

    switch (m_settings->m_LSM9DS1GyroBW) {
    case LSM9DS1_GYRO_BANDWIDTH_0:
        ctrl1 |= 0x00;
        break;

    case LSM9DS1_GYRO_BANDWIDTH_1:
        ctrl1 |= 0x01;
        break;

    case LSM9DS1_GYRO_BANDWIDTH_2:
        ctrl1 |= 0x02;
        break;

    case LSM9DS1_GYRO_BANDWIDTH_3:
        ctrl1 |= 0x03;
        break;
    }

    switch (m_settings->m_LSM9DS1GyroFsr) {
    case LSM9DS1_GYRO_FSR_250:
        ctrl1 |= 0x00;
        m_gyroScale = (RTFLOAT)0.00875 * RTMATH_DEGREE_TO_RAD;
        break;

    case LSM9DS1_GYRO_FSR_500:
        ctrl1 |= 0x08;
        m_gyroScale = (RTFLOAT)0.0175 * RTMATH_DEGREE_TO_RAD;
        break;

    case LSM9DS1_GYRO_FSR_2000:
        ctrl1 |= 0x18;
        m_gyroScale = (RTFLOAT)0.07 * RTMATH_DEGREE_TO_RAD;
        break;

    default:
        HAL_ERROR1("Illegal LSM9DS1 gyro FSR code %d\n", m_settings->m_LSM9DS1GyroFsr);
        return false;
    }
    return (m_settings->HALWrite(m_accelGyroSlaveAddr, LSM9DS1_CTRL1, ctrl1, "Failed to set LSM9DS1 gyro CTRL1"));
}